

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.h
# Opt level: O0

void __thiscall mocker::ast::ExprStmt::~ExprStmt(ExprStmt *this)

{
  ExprStmt *this_local;
  
  ~ExprStmt(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit ExprStmt(std::shared_ptr<Expression> expr) : expr(std::move(expr)) {}